

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiStorage::SetVoidPtr(ImGuiStorage *this,ImGuiID key,void *val)

{
  int *piVar1;
  uint uVar2;
  Pair *pPVar3;
  ImGuiContext *pIVar4;
  Pair *pPVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  
  pIVar4 = GImGui;
  pPVar3 = (this->Data).Data;
  uVar2 = (this->Data).Size;
  pPVar5 = pPVar3;
  uVar9 = uVar2;
  if (0 < (long)(int)uVar2) {
    do {
      uVar6 = uVar9 >> 1;
      uVar10 = uVar6;
      if (pPVar5[uVar6].key < key) {
        uVar10 = uVar9 + ~uVar6;
        pPVar5 = pPVar5 + (ulong)uVar6 + 1;
      }
      uVar9 = uVar10;
    } while (0 < (int)uVar10);
  }
  if ((pPVar5 == pPVar3 + (int)uVar2) || (pPVar5->key != key)) {
    if ((pPVar5 < pPVar3) || (pPVar3 + (int)uVar2 < pPVar5)) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                    ,0x3ab,
                    "iterator ImVector<ImGuiStorage::Pair>::insert(const_iterator, const value_type &) [T = ImGuiStorage::Pair]"
                   );
    }
    lVar11 = (long)pPVar5 - (long)pPVar3;
    uVar9 = (this->Data).Capacity;
    if (uVar2 == uVar9) {
      iVar12 = 4;
      if (uVar9 != 0) {
        iVar12 = uVar9 * 2;
      }
      if ((int)uVar9 < iVar12) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pPVar5 = (Pair *)(*(pIVar4->IO).MemAllocFn)((long)iVar12 << 4);
        pPVar3 = (this->Data).Data;
        if (pPVar3 != (Pair *)0x0) {
          memcpy(pPVar5,pPVar3,(long)(this->Data).Size << 4);
        }
        pPVar3 = (this->Data).Data;
        if (pPVar3 != (Pair *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pPVar3);
        (this->Data).Data = pPVar5;
        (this->Data).Capacity = iVar12;
      }
    }
    lVar7 = (long)(this->Data).Size;
    lVar8 = lVar7 - (lVar11 >> 4);
    if (lVar8 != 0 && lVar11 >> 4 <= lVar7) {
      pPVar3 = (this->Data).Data;
      memmove((void *)((long)pPVar3 + lVar11 + 0x10),(void *)((long)pPVar3 + lVar11),lVar8 * 0x10);
    }
    pPVar3 = (this->Data).Data;
    *(ImGuiID *)((long)pPVar3 + lVar11) = key;
    *(void **)((long)pPVar3 + lVar11 + 8) = val;
    (this->Data).Size = (this->Data).Size + 1;
  }
  else {
    (pPVar5->field_1).val_p = val;
  }
  return;
}

Assistant:

void ImGuiStorage::SetVoidPtr(ImGuiID key, void* val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, Pair(key, val));
        return;
    }
    it->val_p = val;
}